

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_wstring.cpp
# Opt level: O0

ON_wString __thiscall ON_wString::Right(ON_wString *this,int count)

{
  wchar_t *pwVar1;
  int iVar2;
  int in_EDX;
  undefined4 in_register_00000034;
  ON_wString *this_00;
  int local_1c;
  int count_local;
  ON_wString *this_local;
  ON_wString *s;
  
  this_00 = (ON_wString *)CONCAT44(in_register_00000034,count);
  ON_wString(this);
  iVar2 = Length(this_00);
  local_1c = in_EDX;
  if (iVar2 < in_EDX) {
    local_1c = Length(this_00);
  }
  if (0 < local_1c) {
    pwVar1 = this_00->m_s;
    iVar2 = Length(this_00);
    CopyToArray(this,local_1c,pwVar1 + (iVar2 - local_1c));
  }
  return (ON_wString)(wchar_t *)this;
}

Assistant:

ON_wString ON_wString::Right(int count) const
{
  ON_wString s;
  if ( count > Length() )
    count = Length();
  if ( count > 0 ) {
    s.CopyToArray( count, &m_s[Length()-count] );
  }
  return s;
}